

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionNegativeCornerCaseHelper<char,_unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::NegativeCornerCase
               (unsigned_long_long lhs,
               SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               rhs,SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *result)

{
  char cVar1;
  div_t dVar2;
  char *in_RDX;
  int in_EDI;
  char minT;
  char maxT;
  unsigned_long_long tmp;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffd0;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_25;
  char local_24;
  char local_23;
  char local_22;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_21;
  div_t local_20;
  char *local_18;
  int local_10;
  
  local_18 = in_RDX;
  local_10 = in_EDI;
  cVar1 = ::SafeInt::operator_cast_to_char(in_stack_ffffffffffffffd0);
  dVar2 = division_negative_negateU<char,_unsigned_long_long,_false>::div((int)cVar1,local_10);
  local_20 = dVar2;
  cVar1 = std::numeric_limits<char>::max();
  if ((ulong)(long)cVar1 < (ulong)dVar2) {
    local_23 = std::numeric_limits<char>::max();
    if (local_20 != (div_t)((long)local_23 + 1)) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    local_24 = std::numeric_limits<char>::min();
    SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_25,&local_24);
    *local_18 = local_25.m_int;
  }
  else {
    local_22 = ((byte)local_20.quot ^ 0xff) + 1;
    SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_21,&local_22);
    *local_18 = local_21.m_int;
  }
  return true;
}

Assistant:

SAFE_INT_NODISCARD static bool NegativeCornerCase( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        // Problem case - normal casting behavior changes meaning
        // flip rhs to positive
        // any operator casts now do the right thing
        U tmp = division_negative_negateU< T, U, sizeof(T) == 4>::div(rhs, lhs);

        if( tmp <= (U)std::numeric_limits<T>::max() )
        {
            result = SafeInt< T, E >( (T)(~(std::uint64_t)tmp + 1) );
            return true;
        }

        // Corner case
        T maxT = std::numeric_limits<T>::max();
        if( tmp == (U)maxT + 1 )
        {
            T minT = std::numeric_limits<T>::min();
            result = SafeInt< T, E >( minT );
            return true;
        }

        E::SafeIntOnOverflow();
    }